

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O2

Stream * rw::writeSkin(Stream *stream,int32 len,void *object,int32 offset,int32 param_5)

{
  int iVar1;
  Skin *skin;
  undefined4 in_EAX;
  Stream *pSVar2;
  _func_int **pp_Var3;
  ulong uVar4;
  uint8 *puVar5;
  int32 i;
  long lVar6;
  long lVar7;
  undefined8 uStack_38;
  
  iVar1 = version;
  if (*(int **)((long)object + 0x98) == (int *)0x0) {
    skin = *(Skin **)((long)object + (long)offset);
    uStack_38._0_5_ = CONCAT14((char)skin->numBones,in_EAX);
    if (version < 0x34000) {
      puVar5 = (uint8 *)((long)&uStack_38 + 4);
      uStack_38 = (ulong)(uint5)uStack_38;
      pp_Var3 = stream->_vptr_Stream;
      uVar4 = 4;
    }
    else {
      uStack_38 = (ulong)CONCAT16((char)skin->numWeights,
                                  CONCAT15((char)skin->numUsedBones,(uint5)uStack_38));
      (*stream->_vptr_Stream[3])(stream,(long)&uStack_38 + 4,4);
      puVar5 = skin->usedBones;
      uVar4 = (ulong)(uint)skin->numUsedBones;
      pp_Var3 = stream->_vptr_Stream;
    }
    (*pp_Var3[3])(stream,puVar5,uVar4);
    (*stream->_vptr_Stream[3])
              (stream,skin->indices,(ulong)(uint)(*(int *)((long)object + 0x1c) << 2));
    Stream::write32(stream,skin->weights,*(int *)((long)object + 0x1c) << 4);
    lVar7 = 0;
    for (lVar6 = 0; lVar6 < skin->numBones; lVar6 = lVar6 + 1) {
      if (iVar1 < 0x34000) {
        Stream::writeU32(stream,0xdeaddead);
      }
      Stream::write32(stream,(void *)((long)skin->inverseMatrices + lVar7),0x40);
      lVar7 = lVar7 + 0x40;
    }
    if (0x33fff < iVar1) {
      writeSkinSplitData(stream,skin);
    }
  }
  else {
    iVar1 = **(int **)((long)object + 0x98);
    if (iVar1 == 0xb) {
      pSVar2 = wdgl::writeNativeSkin(stream,len,object,offset);
      return pSVar2;
    }
    if (iVar1 == 5) {
      pSVar2 = xbox::writeNativeSkin(stream,len,object,offset);
      return pSVar2;
    }
    if (iVar1 == 4) {
      pSVar2 = ps2::writeNativeSkin(stream,len,object,offset);
      return pSVar2;
    }
    stream = (Stream *)0x0;
  }
  return stream;
}

Assistant:

static Stream*
writeSkin(Stream *stream, int32 len, void *object, int32 offset, int32)
{
	uint8 header[4];
	Geometry *geometry = (Geometry*)object;

	if(geometry->instData){
		if(geometry->instData->platform == PLATFORM_PS2)
			return ps2::writeNativeSkin(stream, len, object, offset);
		else if(geometry->instData->platform == PLATFORM_WDGL)
			return wdgl::writeNativeSkin(stream, len, object, offset);
		else if(geometry->instData->platform == PLATFORM_XBOX)
			return xbox::writeNativeSkin(stream, len, object, offset);
		else{
			assert(0 && "unsupported native skin platform");
			return nil;
		}
	}

	Skin *skin = *PLUGINOFFSET(Skin*, object, offset);
	// not sure which version introduced the new format
	bool oldFormat = version < 0x34000;
	header[0] = skin->numBones;
	if(oldFormat){
		header[1] = 0;
		header[2] = 0;
	}else{
		header[1] = skin->numUsedBones;
		header[2] = skin->numWeights;
	}
	header[3] = 0;
	stream->write8(header, 4);
	if(!oldFormat)
		stream->write8(skin->usedBones, skin->numUsedBones);
	stream->write8(skin->indices, geometry->numVertices*4);
	stream->write32(skin->weights, geometry->numVertices*16);
	for(int32 i = 0; i < skin->numBones; i++){
		if(oldFormat)
			stream->writeU32(0xdeaddead);
		stream->write32(&skin->inverseMatrices[i*16], 64);
	}

	if(!oldFormat)
		writeSkinSplitData(stream, skin);
	return stream;
}